

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie_test.cc
# Opt level: O2

void hbtrie_reverse_iterator_test(void)

{
  hbtrie_result hVar1;
  int iVar2;
  filemgr_ops *ops;
  btree_blk_ops *btree_blk_ops;
  size_t sVar3;
  ulong uVar4;
  char *__format;
  uint64_t uVar5;
  filemgr_open_result fVar6;
  uint64_t v;
  size_t keylen;
  filemgr *local_438;
  uint64_t v_out;
  hbtrie_iterator hit;
  btreeblk_handle bhandle;
  hbtrie trie;
  timeval __test_begin;
  char key [256];
  char key_temp [256];
  filemgr_config config;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  system("rm -rf  hbtrie_testfile");
  memleak_start();
  config.prefetch_duration = 0;
  config.encryption_key.bytes[0] = '\0';
  config.encryption_key.bytes[1] = '\0';
  config.encryption_key.bytes[2] = '\0';
  config.encryption_key.bytes[3] = '\0';
  config.encryption_key.bytes[4] = '\0';
  config.encryption_key.bytes[5] = '\0';
  config.encryption_key.bytes[6] = '\0';
  config.encryption_key.bytes[7] = '\0';
  config.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.do_not_cache_doc_blocks = false;
  config._89_3_ = 0;
  config.num_blocks_readahead = 0;
  config.encryption_key.bytes[0x18] = '\0';
  config.encryption_key.bytes[0x19] = '\0';
  config.encryption_key.bytes[0x1a] = '\0';
  config.encryption_key.bytes[0x1b] = '\0';
  config.encryption_key.bytes[0x1c] = '\0';
  config.encryption_key.bytes[0x1d] = '\0';
  config.encryption_key.bytes[0x1e] = '\0';
  config.encryption_key.bytes[0x1f] = '\0';
  config.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  config.encryption_key.bytes[8] = '\0';
  config.encryption_key.bytes[9] = '\0';
  config.encryption_key.bytes[10] = '\0';
  config.encryption_key.bytes[0xb] = '\0';
  config.encryption_key.bytes[0xc] = '\0';
  config.encryption_key.bytes[0xd] = '\0';
  config.encryption_key.bytes[0xe] = '\0';
  config.encryption_key.bytes[0xf] = '\0';
  config.encryption_key.bytes[0x10] = '\0';
  config.encryption_key.bytes[0x11] = '\0';
  config.encryption_key.bytes[0x12] = '\0';
  config.encryption_key.bytes[0x13] = '\0';
  config.encryption_key.bytes[0x14] = '\0';
  config.encryption_key.bytes[0x15] = '\0';
  config.encryption_key.bytes[0x16] = '\0';
  config.encryption_key.bytes[0x17] = '\0';
  config.blocksize = 0x100;
  config.ncacheblock = 0;
  config.options = '\b';
  config.seqtree_opt = '\0';
  config._18_6_ = 0;
  config.flag = 0;
  config.chunksize = 8;
  config.num_wal_shards = 8;
  config.num_bcache_shards = 0;
  config.encryption_key.algorithm = 0;
  ops = get_filemgr_ops();
  fVar6 = filemgr_open("./hbtrie_testfile",ops,&config,(err_log_callback *)0x0);
  local_438 = fVar6.file;
  btreeblk_init(&bhandle,local_438,0x100);
  btree_blk_ops = btreeblk_get_ops();
  hbtrie_init(&trie,8,8,0x100,0xffffffffffffffff,&bhandle,btree_blk_ops,(void *)0x0,
              _readkey_wrap_memory_itr);
  uVar5 = 0;
  for (uVar4 = 0; uVar4 != 0x1e; uVar4 = uVar4 + 1) {
    v = uVar5;
    sprintf(key,"key%06d",uVar4 & 0xffffffff);
    sVar3 = strlen(key);
    hbtrie_insert(&trie,key,(int)sVar3,&v,&v_out);
    btreeblk_end(&bhandle);
    uVar5 = uVar5 + 0x100000000000000;
  }
  hbtrie_iterator_init(&trie,&hit,(void *)0x0,0);
  uVar4 = 0;
  while( true ) {
    hVar1 = hbtrie_next(&hit,key,&keylen,&v);
    btreeblk_end(&bhandle);
    if (hVar1 != HBTRIE_RESULT_SUCCESS) break;
    v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
        (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
        (v & 0xff00) << 0x28 | v << 0x38;
    sprintf(key_temp,"key%06d",uVar4 & 0xffffffff);
    iVar2 = bcmp(key,key_temp,keylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
              ,0x281);
      hbtrie_reverse_iterator_test()::__test_pass = '\x01';
      iVar2 = bcmp(key,key_temp,keylen);
      if (iVar2 != 0) {
        __assert_fail("!memcmp(key, key_temp, keylen)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x281,"void hbtrie_reverse_iterator_test()");
      }
    }
    if (uVar4 != v) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
              ,0x282);
      hbtrie_reverse_iterator_test()::__test_pass = '\x01';
      if (uVar4 != v) {
        __assert_fail("v == (uint64_t)c",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x282,"void hbtrie_reverse_iterator_test()");
      }
    }
    uVar4 = uVar4 + 1;
  }
  hbtrie_iterator_free(&hit);
  if (uVar4 != 0x1e) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
            ,0x287);
    hbtrie_reverse_iterator_test()::__test_pass = 1;
    __assert_fail("c == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                  ,0x287,"void hbtrie_reverse_iterator_test()");
  }
  iVar2 = 0;
  hbtrie_iterator_init(&trie,&hit,(void *)0x0,0);
  while( true ) {
    hVar1 = hbtrie_prev(&hit,key,&keylen,&v);
    btreeblk_end(&bhandle);
    if (hVar1 != HBTRIE_RESULT_SUCCESS) break;
    v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
        (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
        (v & 0xff00) << 0x28 | v << 0x38;
    iVar2 = iVar2 + -1;
  }
  btreeblk_end(&bhandle);
  hbtrie_iterator_free(&hit);
  if (iVar2 == 0) {
    sprintf(key,"key%06d",0x3c);
    sVar3 = strlen(key);
    hbtrie_iterator_init(&trie,&hit,key,sVar3);
    uVar4 = 0x1d;
    do {
      hVar1 = hbtrie_prev(&hit,key,&keylen,&v);
      btreeblk_end(&bhandle);
      if (hVar1 != HBTRIE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        hbtrie_iterator_free(&hit);
        if (uVar4 != 0xffffffffffffffff) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                  ,0x2a5);
          hbtrie_reverse_iterator_test()::__test_pass = 1;
          __assert_fail("c == n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x2a5,"void hbtrie_reverse_iterator_test()");
        }
        sprintf(key,"key%06dxx",0xf);
        sVar3 = strlen(key);
        hbtrie_iterator_init(&trie,&hit,key,sVar3);
        uVar4 = 0xf;
        do {
          hVar1 = hbtrie_prev(&hit,key,&keylen,&v);
          btreeblk_end(&bhandle);
          if (hVar1 != HBTRIE_RESULT_SUCCESS) {
            btreeblk_end(&bhandle);
            hbtrie_iterator_free(&hit);
            if (uVar4 != 0xffffffffffffffff) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                      ,0x2b6);
              hbtrie_reverse_iterator_test()::__test_pass = 1;
              __assert_fail("c == (n/2)+1",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x2b6,"void hbtrie_reverse_iterator_test()");
            }
            hbtrie_iterator_init(&trie,&hit,(void *)0x0,0);
            uVar4 = 0;
            while( true ) {
              if (uVar4 == 0x15) {
                uVar4 = 0x13;
                while( true ) {
                  if (uVar4 == 9) {
                    uVar4 = 0xb;
                    while( true ) {
                      if (uVar4 == 0x1e) {
                        hVar1 = hbtrie_next(&hit,key,&keylen,&v);
                        btreeblk_end(&bhandle);
                        if (hVar1 == HBTRIE_RESULT_FAIL) {
                          hbtrie_iterator_free(&hit);
                          hbtrie_free(&trie);
                          btreeblk_free(&bhandle);
                          filemgr_close(local_438,true,(char *)0x0,(err_log_callback *)0x0);
                          filemgr_shutdown();
                          memleak_end();
                          __format = "%s PASSED\n";
                          if (hbtrie_reverse_iterator_test()::__test_pass != '\0') {
                            __format = "%s FAILED\n";
                          }
                          fprintf(_stderr,__format,"HB+trie reverse iterator test");
                          return;
                        }
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x2da);
                        hbtrie_reverse_iterator_test()::__test_pass = 1;
                        __assert_fail("hr == HBTRIE_RESULT_FAIL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                      ,0x2da,"void hbtrie_reverse_iterator_test()");
                      }
                      hVar1 = hbtrie_next(&hit,key,&keylen,&v);
                      if (hVar1 == HBTRIE_RESULT_FAIL) break;
                      btreeblk_end(&bhandle);
                      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18
                          | (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18
                          | (v & 0xff00) << 0x28 | v << 0x38;
                      sprintf(key_temp,"key%06d",uVar4 & 0xffffffff);
                      iVar2 = bcmp(key,key_temp,keylen);
                      if (iVar2 != 0) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x2d5);
                        hbtrie_reverse_iterator_test()::__test_pass = '\x01';
                        iVar2 = bcmp(key,key_temp,keylen);
                        if (iVar2 != 0) {
                          __assert_fail("!memcmp(key, key_temp, keylen)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                        ,0x2d5,"void hbtrie_reverse_iterator_test()");
                        }
                      }
                      if (uVar4 != v) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x2d6);
                        hbtrie_reverse_iterator_test()::__test_pass = '\x01';
                        if (uVar4 != v) {
                          __assert_fail("v == (uint64_t)c",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                        ,0x2d6,"void hbtrie_reverse_iterator_test()");
                        }
                      }
                      uVar4 = uVar4 + 1;
                    }
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x2d1);
                    hbtrie_reverse_iterator_test()::__test_pass = 1;
                    __assert_fail("hr != HBTRIE_RESULT_FAIL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                  ,0x2d1,"void hbtrie_reverse_iterator_test()");
                  }
                  hVar1 = hbtrie_prev(&hit,key,&keylen,&v);
                  if (hVar1 == HBTRIE_RESULT_FAIL) break;
                  btreeblk_end(&bhandle);
                  v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
                      (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
                      (v & 0xff00) << 0x28 | v << 0x38;
                  sprintf(key_temp,"key%06d",uVar4 & 0xffffffff);
                  iVar2 = bcmp(key,key_temp,keylen);
                  if (iVar2 != 0) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x2cb);
                    hbtrie_reverse_iterator_test()::__test_pass = '\x01';
                    iVar2 = bcmp(key,key_temp,keylen);
                    if (iVar2 != 0) {
                      __assert_fail("!memcmp(key, key_temp, keylen)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                    ,0x2cb,"void hbtrie_reverse_iterator_test()");
                    }
                  }
                  if (uVar4 != v) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x2cc);
                    hbtrie_reverse_iterator_test()::__test_pass = '\x01';
                    if (uVar4 != v) {
                      __assert_fail("v == (uint64_t)c",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                    ,0x2cc,"void hbtrie_reverse_iterator_test()");
                    }
                  }
                  uVar4 = uVar4 - 1;
                }
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x2c7);
                hbtrie_reverse_iterator_test()::__test_pass = 1;
                __assert_fail("hr != HBTRIE_RESULT_FAIL",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                              ,0x2c7,"void hbtrie_reverse_iterator_test()");
              }
              hVar1 = hbtrie_next(&hit,key,&keylen,&v);
              if (hVar1 == HBTRIE_RESULT_FAIL) break;
              btreeblk_end(&bhandle);
              v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
                  (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
                  (v & 0xff00) << 0x28 | v << 0x38;
              sprintf(key_temp,"key%06d",uVar4 & 0xffffffff);
              iVar2 = bcmp(key,key_temp,keylen);
              if (iVar2 != 0) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x2c1);
                hbtrie_reverse_iterator_test()::__test_pass = '\x01';
                iVar2 = bcmp(key,key_temp,keylen);
                if (iVar2 != 0) {
                  __assert_fail("!memcmp(key, key_temp, keylen)",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x2c1,"void hbtrie_reverse_iterator_test()");
                }
              }
              if (uVar4 != v) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x2c2);
                hbtrie_reverse_iterator_test()::__test_pass = '\x01';
                if (uVar4 != v) {
                  __assert_fail("v == (uint64_t)c",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                                ,0x2c2,"void hbtrie_reverse_iterator_test()");
                }
              }
              uVar4 = uVar4 + 1;
            }
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x2bd);
            hbtrie_reverse_iterator_test()::__test_pass = 1;
            __assert_fail("hr != HBTRIE_RESULT_FAIL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                          ,0x2bd,"void hbtrie_reverse_iterator_test()");
          }
          v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
              (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
              (v & 0xff00) << 0x28 | v << 0x38;
          sprintf(key_temp,"key%06d",uVar4 & 0xffffffff);
          iVar2 = bcmp(key,key_temp,keylen);
          if (iVar2 != 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x2b0);
            hbtrie_reverse_iterator_test()::__test_pass = '\x01';
            iVar2 = bcmp(key,key_temp,keylen);
            if (iVar2 != 0) {
              __assert_fail("!memcmp(key, key_temp, keylen)",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x2b0,"void hbtrie_reverse_iterator_test()");
            }
          }
          if (uVar4 != v) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                    ,0x2b1);
            hbtrie_reverse_iterator_test()::__test_pass = '\x01';
            if (uVar4 != v) {
              __assert_fail("v == (uint64_t)(n/2)-c",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                            ,0x2b1,"void hbtrie_reverse_iterator_test()");
            }
          }
          uVar4 = uVar4 - 1;
        } while( true );
      }
      v = v >> 0x38 | (v & 0xff000000000000) >> 0x28 | (v & 0xff0000000000) >> 0x18 |
          (v & 0xff00000000) >> 8 | (v & 0xff000000) << 8 | (v & 0xff0000) << 0x18 |
          (v & 0xff00) << 0x28 | v << 0x38;
      sprintf(key_temp,"key%06d",uVar4 & 0xffffffff);
      iVar2 = bcmp(key,key_temp,keylen);
      if (iVar2 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x29f);
        hbtrie_reverse_iterator_test()::__test_pass = '\x01';
        iVar2 = bcmp(key,key_temp,keylen);
        if (iVar2 != 0) {
          __assert_fail("!memcmp(key, key_temp, keylen)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x29f,"void hbtrie_reverse_iterator_test()");
        }
      }
      if (uVar4 != v) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x2a0);
        hbtrie_reverse_iterator_test()::__test_pass = '\x01';
        if (uVar4 != v) {
          __assert_fail("v == (uint64_t)n-c-1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                        ,0x2a0,"void hbtrie_reverse_iterator_test()");
        }
      }
      uVar4 = uVar4 - 1;
    } while( true );
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
          ,0x294);
  hbtrie_reverse_iterator_test()::__test_pass = 1;
  __assert_fail("c == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/hbtrie_test.cc"
                ,0x294,"void hbtrie_reverse_iterator_test()");
}

Assistant:

void hbtrie_reverse_iterator_test()
{
    TEST_INIT();

    int ksize = 8, vsize = 8, r, n=30, c;
    int nodesize = 256;
    uint64_t i, v, v_out;
    char key[256], key_temp[256];
    size_t keylen;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct hbtrie trie;
    struct hbtrie_iterator hit;
    struct filemgr_config config;
    hbtrie_result hr;
    filemgr_open_result fr;
    char *fname = (char *) "./hbtrie_testfile";

    r = system(SHELL_DEL" hbtrie_testfile");
    (void)r;
    memleak_start();

    memset(&config, 0, sizeof(config));
    config.blocksize = nodesize;
    config.options = FILEMGR_CREATE;
    config.chunksize = ksize;
    config.num_wal_shards = 8;

    fr = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = fr.file;

    btreeblk_init(&bhandle, file, nodesize);
    hbtrie_init(&trie, ksize, vsize, nodesize, BLK_NOT_FOUND,
        &bhandle, btreeblk_get_ops(), NULL, _readkey_wrap_memory_itr);

    for (i=0;i<(uint64_t)n;++i){
        v = _endian_encode(i);
        sprintf(key, HB_KEYSTR, (int)i);
        hbtrie_insert(&trie, key, strlen(key), &v, &v_out);
        btreeblk_end(&bhandle);
    }

    c = 0;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    while( (hr=hbtrie_next(&hit, key, &keylen, &v)) == HBTRIE_RESULT_SUCCESS) {
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == n);

    c = 0;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == 0);

    c = 0;
    sprintf(key, HB_KEYSTR, (int)n*2);
    hbtrie_iterator_init(&trie, &hit, key, strlen(key));
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)(n-c-1));
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)n-c-1);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == n);

    c = 0;
    sprintf(key, HB_KEYSTR"xx", (int)n/2);
    hbtrie_iterator_init(&trie, &hit, key, strlen(key));
    while(1) {
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        btreeblk_end(&bhandle);
        if (hr != HBTRIE_RESULT_SUCCESS) break;
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)((n/2)-c));
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)(n/2)-c);
        c++;
    }
    btreeblk_end(&bhandle);
    hbtrie_iterator_free(&hit);
    TEST_CHK(c == (n/2)+1);

    c = -1;
    hbtrie_iterator_init(&trie, &hit, NULL, 0);
    for (i=0;i<21;++i){
        c++;
        hr=hbtrie_next(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    for (i=0;i<10;++i){
        c--;
        hr=hbtrie_prev(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    for (i=0;i<19;++i){
        c++;
        hr=hbtrie_next(&hit, key, &keylen, &v);
        TEST_CHK(hr != HBTRIE_RESULT_FAIL);
        btreeblk_end(&bhandle);
        v = _endian_decode(v);
        sprintf(key_temp, HB_KEYSTR, (int)c);
        TEST_CHK(!memcmp(key, key_temp, keylen));
        TEST_CHK(v == (uint64_t)c);
    }
    hr=hbtrie_next(&hit, key, &keylen, &v);
    btreeblk_end(&bhandle);
    TEST_CHK(hr == HBTRIE_RESULT_FAIL);
    hbtrie_iterator_free(&hit);

    hbtrie_free(&trie);
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    memleak_end();

    TEST_RESULT("HB+trie reverse iterator test");
}